

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptesttest.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  string *psVar2;
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [32];
  HelloWorld local_28 [8];
  HelloWorld greeter;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"Hello World!",&local_49);
  HelloWorld::HelloWorld(local_28,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  HelloWorld::Print();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80," Have a good one!",&local_81);
  HelloWorld::Append((string *)local_28);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  HelloWorld::Print();
  poVar1 = std::operator<<((ostream *)&std::cout,"The message: ");
  psVar2 = HelloWorld::GetMessage_abi_cxx11_(local_28);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  HelloWorld::Reverse();
  HelloWorld::Print();
  HelloWorld::~HelloWorld(local_28);
  return 0;
}

Assistant:

int main()
{
    HelloWorld greeter("Hello World!");
    greeter.Print();
    greeter.Append(" Have a good one!");
    greeter.Print();
    std::cout << "The message: " << greeter.GetMessage() << std::endl;
    greeter.Reverse();
    greeter.Print();
}